

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::NeuralNetworkPreprocessing::ByteSizeLong(NeuralNetworkPreprocessing *this)

{
  PreprocessorCase PVar1;
  int iVar2;
  long lVar3;
  string *value;
  size_t sVar4;
  size_t sStack_18;
  int cached_size;
  size_t total_size;
  NeuralNetworkPreprocessing *this_local;
  
  sStack_18 = 0;
  featurename_abi_cxx11_(this);
  lVar3 = std::__cxx11::string::size();
  if (lVar3 != 0) {
    value = featurename_abi_cxx11_(this);
    sStack_18 = google::protobuf::internal::WireFormatLite::StringSize(value);
    sStack_18 = sStack_18 + 1;
  }
  PVar1 = preprocessor_case(this);
  if (PVar1 != PREPROCESSOR_NOT_SET) {
    if (PVar1 == kScaler) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkImageScaler>
                        ((this->preprocessor_).scaler_);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
    else if (PVar1 == kMeanImage) {
      sVar4 = google::protobuf::internal::WireFormatLite::
              MessageSizeNoVirtual<CoreML::Specification::NeuralNetworkMeanImage>
                        ((this->preprocessor_).meanimage_);
      sStack_18 = sVar4 + 1 + sStack_18;
    }
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  this->_cached_size_ = iVar2;
  return sStack_18;
}

Assistant:

size_t NeuralNetworkPreprocessing::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NeuralNetworkPreprocessing)
  size_t total_size = 0;

  // string featureName = 1;
  if (this->featurename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->featurename());
  }

  switch (preprocessor_case()) {
    // .CoreML.Specification.NeuralNetworkImageScaler scaler = 10;
    case kScaler: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *preprocessor_.scaler_);
      break;
    }
    // .CoreML.Specification.NeuralNetworkMeanImage meanImage = 11;
    case kMeanImage: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *preprocessor_.meanimage_);
      break;
    }
    case PREPROCESSOR_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}